

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

bool anon_unknown.dwarf_2bb0f::ScrollWhenDraggingOnVoid(ImVec2 *delta,ImGuiMouseButton mouse_button)

{
  float fVar1;
  ImGuiWindow *pIVar2;
  uint uVar3;
  long lVar4;
  bool held;
  bool hovered;
  bool local_32;
  bool local_31;
  ImRect local_30;
  
  lVar4 = ImGui::GetCurrentContext();
  pIVar2 = *(ImGuiWindow **)(lVar4 + 0x1a88);
  local_31 = false;
  local_32 = false;
  if (*(int *)(lVar4 + 0x1ac4) == 0) {
    local_30.Min.x = *(float *)(pIVar2 + 0x10);
    local_30.Min.y = *(float *)(pIVar2 + 0x14);
    local_30.Max.x = (float)*(undefined8 *)(pIVar2 + 0x18) + local_30.Min.x;
    local_30.Max.y = (float)((ulong)*(undefined8 *)(pIVar2 + 0x18) >> 0x20) + local_30.Min.y;
    uVar3 = ImGuiWindow::GetID((char *)pIVar2,"##scrolldraggingoverlay");
    ImGui::ButtonBehavior(&local_30,uVar3,&local_31,&local_32,1);
    if ((local_32 & 1U) != 0) {
      fVar1 = delta->x;
      if ((fVar1 != 0.0) || (NAN(fVar1))) {
        ImGui::SetScrollX(pIVar2,fVar1 + *(float *)(pIVar2 + 0x54));
      }
    }
    if ((local_32 & 1U) != 0) {
      fVar1 = delta->y;
      if ((fVar1 != 0.0) || (NAN(fVar1))) {
        ImGui::SetScrollY(pIVar2,fVar1 + *(float *)(pIVar2 + 0x58));
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool ScrollWhenDraggingOnVoid(const ImVec2& delta, ImGuiMouseButton mouse_button) {
    ImGuiContext& g = *ImGui::GetCurrentContext();
    ImGuiWindow* window = g.CurrentWindow;
    bool hovered = false;
    bool held = false;
    bool dragging = false;
    ImGuiButtonFlags button_flags = (mouse_button == 0) ? ImGuiButtonFlags_MouseButtonLeft : (mouse_button == 1) ? ImGuiButtonFlags_MouseButtonRight : ImGuiButtonFlags_MouseButtonMiddle;
    if (g.HoveredId == 0) // If nothing hovered so far in the frame (not same as IsAnyItemHovered()!)
        ImGui::ButtonBehavior(window->Rect(), window->GetID("##scrolldraggingoverlay"), &hovered, &held, button_flags);
    if (held && delta.x != 0.0f) {
        ImGui::SetScrollX(window, window->Scroll.x + delta.x);
    }
    if (held && delta.y != 0.0f) {
        ImGui::SetScrollY(window, window->Scroll.y + delta.y);
        dragging = true;
    }
    return dragging;
}